

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_client.c
# Opt level: O0

void uo_tcp_client_connect(uo_tcp_client *tcp_client)

{
  int iVar1;
  char *pcVar2;
  uo_tcp_conn *tcp_conn_00;
  uo_tcp_conn *tcp_conn;
  int local_50;
  int opt_TCP_NODELAY;
  int sockfd;
  int s;
  addrinfo *res;
  addrinfo hints;
  uo_tcp_client *tcp_client_local;
  
  hints.ai_next = (addrinfo *)tcp_client;
  memset(&res,0,0x30);
  hints.ai_flags = 1;
  hints.ai_family = 6;
  opt_TCP_NODELAY =
       getaddrinfo(*(char **)&hints.ai_next[2].ai_socktype,*(char **)&hints.ai_next[2].ai_addrlen,
                   (addrinfo *)&res,(addrinfo **)&sockfd);
  if (opt_TCP_NODELAY == 0) {
    local_50 = socket(_sockfd->ai_family,1,6);
    if (local_50 == -1) {
      uo_err("Unable to create socket.");
    }
    else {
      tcp_conn._4_4_ = 1;
      iVar1 = uo_setsockopt(local_50,6,1,(void *)((long)&tcp_conn + 4),4);
      if (iVar1 == -1) {
        uo_err("Could not set TCP_NODELAY option.");
      }
      iVar1 = connect(local_50,_sockfd->ai_addr,_sockfd->ai_addrlen);
      if (iVar1 != -1) {
        freeaddrinfo(_sockfd);
        tcp_conn_00 = uo_tcp_conn_create_for_client(local_50,(uo_tcp_client *)hints.ai_next);
        uo_tcp_conn_open(tcp_conn_00);
        return;
      }
      uo_err("Unable to connect socket.");
      close(local_50);
    }
    freeaddrinfo(_sockfd);
  }
  else {
    pcVar2 = gai_strerror(opt_TCP_NODELAY);
    uo_err("Unable to get specified service address. getaddrinfo: %s",pcVar2);
  }
  return;
}

Assistant:

void uo_tcp_client_connect(
    uo_tcp_client *tcp_client)
{
    struct addrinfo hints = {
        .ai_family = AF_UNSPEC,
        .ai_socktype = SOCK_STREAM,
        .ai_protocol = IPPROTO_TCP
    }, *res;

    int s = getaddrinfo(tcp_client->hostname, tcp_client->port, &hints, &res);
    if (s != 0)
        uo_err_goto(err_return, "Unable to get specified service address. getaddrinfo: %s", gai_strerror(s));

    int sockfd = socket(res->ai_family, SOCK_STREAM, IPPROTO_TCP);
    if (sockfd == -1)
        uo_err_goto(err_freeaddrinfo, "Unable to create socket.");

    int opt_TCP_NODELAY = true;
    if (uo_setsockopt(sockfd, IPPROTO_TCP, TCP_NODELAY, &opt_TCP_NODELAY, sizeof opt_TCP_NODELAY) == -1)
        uo_err("Could not set TCP_NODELAY option.");

    if (connect(sockfd, res->ai_addr, res->ai_addrlen) == -1)
        uo_err_goto(err_close, "Unable to connect socket.");

    freeaddrinfo(res);

    uo_tcp_conn *tcp_conn = uo_tcp_conn_create_for_client(sockfd, tcp_client);
    uo_tcp_conn_open(tcp_conn);

    return;

err_close:
    close(sockfd);

err_freeaddrinfo:
    freeaddrinfo(res);

err_return:;
}